

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::ColorPickerStyle> __thiscall
gui::DefaultTheme::makeColorPickerStyle(DefaultTheme *this)

{
  element_type *boxSpacing;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ColorPickerStyle *in_RDI;
  shared_ptr<gui::ColorPickerStyle> sVar1;
  shared_ptr<gui::ColorPickerStyle> *style;
  Color *in_stack_ffffffffffffffb8;
  float thickness;
  Vector2<float> local_2c [2];
  uint7 in_stack_ffffffffffffffe8;
  
  std::make_shared<gui::ColorPickerStyle,gui::Gui_const&>((Gui *)(ulong)in_stack_ffffffffffffffe8);
  std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x169fd8);
  ColorPickerStyle::setOutlineColor(in_RDI,in_stack_ffffffffffffffb8);
  thickness = (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x169ff3);
  ColorPickerStyle::setOutlineThickness(in_RDI,thickness);
  std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a00f);
  ColorPickerStyle::setDotRadius(in_RDI,thickness);
  std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a02b);
  ColorPickerStyle::setBarWidth(in_RDI,thickness);
  std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a047);
  ColorPickerStyle::setBarSpacing(in_RDI,thickness);
  boxSpacing = std::
               __shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16a063);
  sf::Vector2<float>::Vector2(local_2c,5.0,5.0);
  ColorPickerStyle::setBoxSpacing(in_RDI,(Vector2f *)boxSpacing);
  sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::ColorPickerStyle>)
         sVar1.super___shared_ptr<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ColorPickerStyle> DefaultTheme::makeColorPickerStyle() const {
    auto style = std::make_shared<ColorPickerStyle>(gui_);
    style->setOutlineColor(sf::Color::White);
    style->setOutlineThickness(-2.0f);

    style->setDotRadius(5.0f);
    style->setBarWidth(20.0f);
    style->setBarSpacing(5.0f);
    style->setBoxSpacing({5.0f, 5.0f});

    return style;
}